

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

uintmax_t ghc::filesystem::file_size(path *p)

{
  bool bVar1;
  int code;
  filesystem_error *this;
  error_code ec_00;
  string local_48;
  uintmax_t local_28;
  uintmax_t result;
  error_code ec;
  path *p_local;
  
  ec._M_cat = (error_category *)p;
  std::error_code::error_code((error_code *)&result);
  local_28 = file_size((path *)ec._M_cat,(error_code *)&result);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&result);
  if (!bVar1) {
    return local_28;
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  code = std::error_code::value((error_code *)&result);
  detail::systemErrorText<int>(&local_48,code);
  ec_00._0_8_ = result & 0xffffffff;
  ec_00._M_cat = (error_category *)ec._0_8_;
  filesystem_error::filesystem_error(this,&local_48,(path *)ec._M_cat,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE uintmax_t file_size(const path& p)
{
    std::error_code ec;
    auto result = file_size(p, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p, ec);
    }
    return result;
}